

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::check_portable_serialization(roaring64_bitmap_t *r1)

{
  _Bool _Var1;
  size_t __n;
  size_t sVar2;
  roaring64_bitmap_t *r1_00;
  allocator_type local_32;
  value_type_conflict local_31;
  vector<char,_std::allocator<char>_> buf;
  
  __n = roaring64_bitmap_portable_size_in_bytes((roaring64_bitmap_t *)r1);
  local_31 = '\0';
  std::vector<char,_std::allocator<char>_>::vector(&buf,__n,&local_31,&local_32);
  sVar2 = roaring64_bitmap_portable_serialize
                    ((roaring64_bitmap_t *)r1,
                     buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  _assert_int_equal(sVar2,__n,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x5e4);
  sVar2 = roaring64_bitmap_portable_deserialize_size
                    (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,0xffffffffffffffff);
  _assert_int_equal(sVar2,__n,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x5e7);
  r1_00 = roaring64_bitmap_portable_deserialize_safe
                    (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,__n);
  assert_r64_valid((roaring64_bitmap_t *)r1_00);
  _Var1 = roaring64_bitmap_equals(r1_00,(roaring64_bitmap_t *)r1);
  _assert_true((ulong)_Var1,"roaring64_bitmap_equals(r2, r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x5eb);
  roaring64_bitmap_free(r1_00);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buf.super__Vector_base<char,_std::allocator<char>_>);
  return;
}

Assistant:

void check_portable_serialization(const roaring64_bitmap_t* r1) {
    size_t serialized_size = roaring64_bitmap_portable_size_in_bytes(r1);
    std::vector<char> buf(serialized_size, 0);
    size_t serialized = roaring64_bitmap_portable_serialize(r1, buf.data());
    assert_int_equal(serialized, serialized_size);
    size_t deserialized_size =
        roaring64_bitmap_portable_deserialize_size(buf.data(), SIZE_MAX);
    assert_int_equal(deserialized_size, serialized_size);
    roaring64_bitmap_t* r2 =
        roaring64_bitmap_portable_deserialize_safe(buf.data(), serialized_size);
    assert_r64_valid(r2);
    assert_true(roaring64_bitmap_equals(r2, r1));
    roaring64_bitmap_free(r2);
}